

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stats.cpp
# Opt level: O1

double chooseK(int n,int k)

{
  int iVar1;
  int iVar2;
  int iVar3;
  double dVar4;
  
  iVar2 = n - k;
  if (k <= n - k) {
    iVar2 = k;
  }
  if (0 < iVar2) {
    dVar4 = 1.0;
    iVar3 = 1;
    do {
      iVar1 = (1 - iVar2) + iVar3;
      dVar4 = dVar4 * ((double)n / (double)iVar3);
      iVar3 = iVar3 + 1;
      n = n + -1;
    } while (iVar1 != 1);
    return dVar4;
  }
  return 1.0;
}

Assistant:

double chooseK ( int n, int k )
{
  if(k > (n - k)) k = n - k;

  double c = 1;

  for(int i = 0; i < k; i++)
  {
    double t = double(n-i) / double(i+1);

    c *= t;
  }

    return c;
}